

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O2

feed_db_status_t store_calendar_record_db(calendar_record_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  sqlite3_stmt *stmt;
  char qr [166];
  
  memcpy(qr,
         "INSERT INTO calendar (service_id,monday, tuesday, wednesday, thursday, friday, saturday, sunday,start_date, end_date) values (?1,?2, ?3, ?4, ?5, ?6, ?7, ?8,?9, ?10);"
         ,0xa6);
  sqlite3_prepare_v2(db->conn,qr,-1,&stmt,(char **)0x0);
  sqlite3_bind_text(stmt,1,record->service_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(stmt,2,record->monday);
  sqlite3_bind_int(stmt,3,record->tuesday);
  sqlite3_bind_int(stmt,4,record->wednesday);
  sqlite3_bind_int(stmt,5,record->thursday);
  sqlite3_bind_int(stmt,6,record->friday);
  sqlite3_bind_int(stmt,7,record->saturday);
  sqlite3_bind_int(stmt,8,record->sunday);
  sqlite3_bind_text(stmt,9,record->start_date,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stmt,10,record->end_date,-1,(_func_void_void_ptr *)0x0);
  iVar1 = sqlite3_step(stmt);
  db->rc = iVar1;
  if (iVar1 != 0x65) {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
  }
  sqlite3_finalize(stmt);
  return (uint)(iVar1 == 0x65);
}

Assistant:

feed_db_status_t store_calendar_record_db(calendar_record_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO calendar ("
                    "service_id,"
                    "monday, tuesday, wednesday, thursday, friday, saturday, sunday,"
                    "start_date, end_date"
                ") values ("
                    "?1,"
                    "?2, ?3, ?4, ?5, ?6, ?7, ?8,"
                    "?9, ?10"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->service_id, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 2, (int)record->monday);
    sqlite3_bind_int(stmt, 3, (int)record->tuesday);
    sqlite3_bind_int(stmt, 4, (int)record->wednesday);
    sqlite3_bind_int(stmt, 5, (int)record->thursday);
    sqlite3_bind_int(stmt, 6, (int)record->friday);
    sqlite3_bind_int(stmt, 7, (int)record->saturday);
    sqlite3_bind_int(stmt, 8, (int)record->sunday);
    sqlite3_bind_text(stmt, 9, record->start_date, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 10, record->end_date, -1, SQLITE_STATIC);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}